

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::anon_unknown_36::WebSocketPipeImpl::BlockedPumpTo::abort(BlockedPumpTo *this)

{
  undefined1 local_21;
  ArrayPtr<const_char> local_20;
  BlockedPumpTo *local_10;
  BlockedPumpTo *this_local;
  
  local_10 = this;
  StringPtr::StringPtr((StringPtr *)&local_20,"other end of WebSocketPipe was destroyed");
  Canceler::cancel(&this->canceler,(StringPtr)local_20);
  (*(this->fulfiller->super_PromiseRejector)._vptr_PromiseRejector[2])(this->fulfiller,&local_21);
  endState(this->pipe,&this->super_WebSocket);
  WebSocketPipeImpl::abort(this->pipe);
  return;
}

Assistant:

void abort() override {
      canceler.cancel("other end of WebSocketPipe was destroyed");

      // abort() is called when the pipe end is dropped. This should be treated as disconnecting,
      // so pumpTo() should complete normally.
      fulfiller.fulfill();

      pipe.endState(*this);
      pipe.abort();
    }